

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extend.c
# Opt level: O0

int dobindkey(KEYMAP *map,char *func,char *str)

{
  int iVar1;
  int local_24;
  char *pcStack_20;
  int i;
  char *str_local;
  char *func_local;
  KEYMAP *map_local;
  
  local_24 = 0;
  func_local = (char *)map;
  for (pcStack_20 = str; *pcStack_20 != '\0' && local_24 < 8; pcStack_20 = pcStack_20 + 1) {
    if ((*pcStack_20 == '^') && (pcStack_20[1] != '\0')) {
      iVar1 = toupper((uint)(byte)pcStack_20[1]);
      key.k_chars[local_24] = (ushort)iVar1 ^ 0x40;
      pcStack_20 = pcStack_20 + 1;
    }
    else if ((*pcStack_20 == '\\') && (pcStack_20[1] != '\0')) {
      switch(pcStack_20[1]) {
      case 'E':
      case 'e':
        key.k_chars[local_24] = 0x1b;
        break;
      case 'N':
      case 'n':
        key.k_chars[local_24] = (short)*curbp->b_nlchr;
        break;
      case 'R':
      case 'r':
        key.k_chars[local_24] = 0xd;
        break;
      case 'T':
      case 't':
        key.k_chars[local_24] = 9;
        break;
      case '\\':
        key.k_chars[local_24] = 0x5c;
        break;
      case '^':
        key.k_chars[local_24] = 0x5e;
      }
      pcStack_20 = pcStack_20 + 1;
    }
    else {
      key.k_chars[local_24] = (short)*pcStack_20;
    }
    local_24 = local_24 + 1;
  }
  key.k_count = local_24;
  iVar1 = bindkey((KEYMAP **)&func_local,func,key.k_chars,local_24);
  return iVar1;
}

Assistant:

int
dobindkey(KEYMAP *map, const char *func, const char *str)
{
	int	 i;

	for (i = 0; *str && i < MAXKEY; i++) {
		/* XXX - convert numbers w/ strol()? */
		if (*str == '^' && *(str + 1) !=  '\0') {
			key.k_chars[i] = CCHR(toupper((unsigned char)*++str));
		} else if (*str == '\\' && *(str + 1) != '\0') {
			switch (*++str) {
			case '^':
				key.k_chars[i] = '^';
				break;
			case 't':
			case 'T':
				key.k_chars[i] = '\t';
				break;
			case 'n':
			case 'N':
				key.k_chars[i] = *curbp->b_nlchr;
				break;
			case 'r':
			case 'R':
				key.k_chars[i] = '\r';
				break;
			case 'e':
			case 'E':
				key.k_chars[i] = CCHR('[');
				break;
			case '\\':
				key.k_chars[i] = '\\';
				break;
			}
		} else
			key.k_chars[i] = *str;
		str++;
	}
	key.k_count = i;
	return (bindkey(&map, func, key.k_chars, key.k_count));
}